

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_vpeconf1_mips(CPUMIPSState *env,target_ulong_conflict arg1)

{
  uint local_18;
  uint32_t newval;
  uint32_t mask;
  target_ulong_conflict arg1_local;
  CPUMIPSState *env_local;
  
  local_18 = 0;
  if ((env->mvp->CP0_MVPControl & 2U) != 0) {
    local_18 = 0xff3fcff;
  }
  env->CP0_VPEConf1 = env->CP0_VPEConf1 & (local_18 ^ 0xffffffff) | arg1 & local_18;
  return;
}

Assistant:

void helper_mtc0_vpeconf1(CPUMIPSState *env, target_ulong arg1)
{
    uint32_t mask = 0;
    uint32_t newval;

    if (env->mvp->CP0_MVPControl & (1 << CP0MVPCo_VPC))
        mask |= (0xff << CP0VPEC1_NCX) | (0xff << CP0VPEC1_NCP2) |
                (0xff << CP0VPEC1_NCP1);
    newval = (env->CP0_VPEConf1 & ~mask) | (arg1 & mask);

    /* UDI not implemented. */
    /* CP2 not implemented. */

    /* TODO: Handle FPU (CP1) binding. */

    env->CP0_VPEConf1 = newval;
}